

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O2

bool __thiscall
testing::internal::DefaultDeathTestFactory::Create
          (DefaultDeathTestFactory *this,char *statement,
          Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
          *matcher,char *file,int line,DeathTest **test)

{
  int iVar1;
  int iVar2;
  InternalRunDeathTestFlag *__lhs;
  bool bVar3;
  UnitTestImpl *pUVar4;
  ExecDeathTest *this_00;
  NoExecDeathTest *this_01;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  *this_02;
  string *this_03;
  int death_test_index;
  char *local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  int local_104;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_e0;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_c8;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  local_130 = statement;
  pUVar4 = GetUnitTestImpl();
  __lhs = (pUVar4->internal_run_death_test_flag_)._M_t.
          super___uniq_ptr_impl<testing::internal::InternalRunDeathTestFlag,_std::default_delete<testing::internal::InternalRunDeathTestFlag>_>
          ._M_t.
          super__Tuple_impl<0UL,_testing::internal::InternalRunDeathTestFlag_*,_std::default_delete<testing::internal::InternalRunDeathTestFlag>_>
          .super__Head_base<0UL,_testing::internal::InternalRunDeathTestFlag_*,_false>._M_head_impl;
  iVar2 = (pUVar4->current_test_info_->result_).death_test_count_;
  iVar1 = iVar2 + 1;
  (pUVar4->current_test_info_->result_).death_test_count_ = iVar1;
  death_test_index = iVar1;
  if (__lhs != (InternalRunDeathTestFlag *)0x0) {
    if (__lhs->index_ <= iVar2) {
      StreamableToString<int>(&local_50,&death_test_index);
      std::operator+(&local_90,"Death test count (",&local_50);
      std::operator+(&local_70,&local_90,") somehow exceeded expected maximum (");
      local_104 = __lhs->index_;
      StreamableToString<int>(&local_b0,&local_104);
      std::operator+(&local_100,&local_70,&local_b0);
      std::operator+(&local_128,&local_100,")");
      DeathTest::set_last_death_test_message(&local_128);
      std::__cxx11::string::~string((string *)&local_128);
      std::__cxx11::string::~string((string *)&local_100);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_90);
      this_03 = &local_50;
      goto LAB_0010bc3b;
    }
    bVar3 = std::operator==(&__lhs->file_,file);
    if (((!bVar3) || (__lhs->line_ != line)) || (__lhs->index_ != iVar1)) {
      *test = (DeathTest *)0x0;
      return true;
    }
  }
  bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          FLAGS_gtest_death_test_style_abi_cxx11_,"threadsafe");
  if (bVar3) {
    this_00 = (ExecDeathTest *)operator_new(0x50);
    local_c8.vtable_ =
         (matcher->
         super_MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
         ).vtable_;
    local_c8.buffer_ =
         (matcher->
         super_MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
         ).buffer_;
    (matcher->
    super_MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ).vtable_ = (VTable *)0x0;
    local_c8.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
         (_func_int **)&PTR__MatcherBase_00140ef0;
    ExecDeathTest::ExecDeathTest
              (this_00,local_130,
               (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&local_c8,file,line);
    *test = (DeathTest *)this_00;
    this_02 = &local_c8;
  }
  else {
    bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            FLAGS_gtest_death_test_style_abi_cxx11_,"fast");
    if (!bVar3) {
      std::operator+(&local_100,"Unknown death test style \"",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     FLAGS_gtest_death_test_style_abi_cxx11_);
      std::operator+(&local_128,&local_100,"\" encountered");
      DeathTest::set_last_death_test_message(&local_128);
      std::__cxx11::string::~string((string *)&local_128);
      this_03 = &local_100;
LAB_0010bc3b:
      std::__cxx11::string::~string((string *)this_03);
      return false;
    }
    this_01 = (NoExecDeathTest *)operator_new(0x40);
    local_e0.vtable_ =
         (matcher->
         super_MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
         ).vtable_;
    local_e0.buffer_ =
         (matcher->
         super_MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
         ).buffer_;
    (matcher->
    super_MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ).vtable_ = (VTable *)0x0;
    local_e0.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
         (_func_int **)&PTR__MatcherBase_00140ef0;
    NoExecDeathTest::NoExecDeathTest
              (this_01,local_130,
               (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&local_e0);
    *test = (DeathTest *)this_01;
    this_02 = &local_e0;
  }
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::~MatcherBase(this_02);
  return true;
}

Assistant:

bool DefaultDeathTestFactory::Create(const char* statement,
                                     Matcher<const std::string&> matcher,
                                     const char* file, int line,
                                     DeathTest** test) {
  UnitTestImpl* const impl = GetUnitTestImpl();
  const InternalRunDeathTestFlag* const flag =
      impl->internal_run_death_test_flag();
  const int death_test_index =
      impl->current_test_info()->increment_death_test_count();

  if (flag != nullptr) {
    if (death_test_index > flag->index()) {
      DeathTest::set_last_death_test_message(
          "Death test count (" + StreamableToString(death_test_index) +
          ") somehow exceeded expected maximum (" +
          StreamableToString(flag->index()) + ")");
      return false;
    }

    if (!(flag->file() == file && flag->line() == line &&
          flag->index() == death_test_index)) {
      *test = nullptr;
      return true;
    }
  }

#ifdef GTEST_OS_WINDOWS

  if (GTEST_FLAG_GET(death_test_style) == "threadsafe" ||
      GTEST_FLAG_GET(death_test_style) == "fast") {
    *test = new WindowsDeathTest(statement, std::move(matcher), file, line);
  }

#elif defined(GTEST_OS_FUCHSIA)

  if (GTEST_FLAG_GET(death_test_style) == "threadsafe" ||
      GTEST_FLAG_GET(death_test_style) == "fast") {
    *test = new FuchsiaDeathTest(statement, std::move(matcher), file, line);
  }

#else

  if (GTEST_FLAG_GET(death_test_style) == "threadsafe") {
    *test = new ExecDeathTest(statement, std::move(matcher), file, line);
  } else if (GTEST_FLAG_GET(death_test_style) == "fast") {
    *test = new NoExecDeathTest(statement, std::move(matcher));
  }

#endif  // GTEST_OS_WINDOWS

  else {  // NOLINT - this is more readable than unbalanced brackets inside #if.
    DeathTest::set_last_death_test_message("Unknown death test style \"" +
                                           GTEST_FLAG_GET(death_test_style) +
                                           "\" encountered");
    return false;
  }